

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlDOMWrapNSNormAddNsMapItem2
              (xmlNsPtr **list,int *size,int *number,xmlNsPtr oldNs,xmlNsPtr newNs)

{
  int iVar1;
  xmlNsPtr *ppxVar2;
  uint uVar3;
  int iVar4;
  
  iVar1 = *size;
  if (iVar1 <= *number) {
    if (iVar1 < 1) {
      iVar4 = 3;
    }
    else {
      iVar4 = -1;
      if (iVar1 < 1000000000) {
        uVar3 = iVar1 + 1U >> 1;
        iVar4 = uVar3 + iVar1;
        if ((int)(1000000000 - uVar3) < iVar1) {
          iVar4 = 1000000000;
        }
      }
    }
    if (iVar4 < 0) {
      return -1;
    }
    ppxVar2 = (xmlNsPtr *)(*xmlRealloc)(*list,(ulong)(uint)(iVar4 * 2) << 3);
    if (ppxVar2 == (xmlNsPtr *)0x0) {
      return -1;
    }
    *list = ppxVar2;
    *size = iVar4;
  }
  iVar1 = *number;
  (*list)[(long)iVar1 * 2] = oldNs;
  (*list)[iVar1 * 2 + 1] = newNs;
  *number = iVar1 + 1;
  return 0;
}

Assistant:

static int
xmlDOMWrapNSNormAddNsMapItem2(xmlNsPtr **list, int *size, int *number,
			xmlNsPtr oldNs, xmlNsPtr newNs)
{
    if (*number >= *size) {
        xmlNsPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(*size, 2 * sizeof(tmp[0]), 3, XML_MAX_ITEMS);
        if (newSize < 0)
            return(-1);
        tmp = xmlRealloc(*list, newSize * 2 * sizeof(tmp[0]));
        if (tmp == NULL)
            return(-1);
        *list = tmp;
        *size = newSize;
    }

    (*list)[2 * (*number)] = oldNs;
    (*list)[2 * (*number) +1] = newNs;
    (*number)++;
    return (0);
}